

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O1

CURLcode get_libcurl_info(void)

{
  char **ppcVar1;
  int iVar2;
  char **cpp;
  char **ppcVar3;
  feature_name_presentp *pfVar4;
  CURLcode CVar5;
  char *pcVar6;
  proto_name_tokenp *ppVar7;
  
  curlinfo = (curl_version_info_data *)curl_version_info(0xb);
  if (curlinfo == (curl_version_info_data *)0x0) {
    CVar5 = CURLE_FAILED_INIT;
  }
  else {
    ppcVar3 = curlinfo->protocols;
    if (ppcVar3 != (char **)0x0) {
      pcVar6 = *ppcVar3;
      built_in_protos = ppcVar3;
      while (pcVar6 != (char *)0x0) {
        ppVar7 = possibly_built_in;
        pcVar6 = "file";
        do {
          ppVar7 = ppVar7 + 1;
          iVar2 = curl_strequal(pcVar6,*ppcVar3);
          if (iVar2 != 0) {
            *ppVar7[-1].proto_tokenp = *ppcVar3;
            break;
          }
          pcVar6 = ppVar7->proto_name;
        } while (pcVar6 != (char *)0x0);
        pcVar6 = ppcVar3[1];
        ppcVar3 = ppcVar3 + 1;
      }
      proto_count = (long)ppcVar3 - (long)built_in_protos >> 3;
    }
    if ((curlinfo->age < CURLVERSION_ELEVENTH) ||
       (ppcVar3 = curlinfo->feature_names, curlinfo->feature_names == (char **)0x0)) {
      ppcVar3 = fnames;
      pcVar6 = "alt-svc";
      pfVar4 = maybe_feature;
      do {
        pfVar4 = pfVar4 + 1;
        if ((curlinfo->features & pfVar4[-1].feature_bitmask) != 0) {
          *ppcVar3 = pcVar6;
          ppcVar3 = ppcVar3 + 1;
        }
        pcVar6 = pfVar4->feature_name;
      } while (pcVar6 != (char *)0x0);
      *ppcVar3 = (char *)0x0;
      ppcVar3 = feature_names;
    }
    feature_names = ppcVar3;
    pcVar6 = *feature_names;
    ppcVar3 = feature_names;
    while (CVar5 = CURLE_OK, pcVar6 != (char *)0x0) {
      pfVar4 = maybe_feature;
      pcVar6 = "alt-svc";
      do {
        pfVar4 = pfVar4 + 1;
        iVar2 = curl_strequal(pcVar6,*ppcVar3);
        if (iVar2 != 0) {
          if (pfVar4[-1].feature_presentp != (_Bool *)0x0) {
            *pfVar4[-1].feature_presentp = true;
          }
          break;
        }
        pcVar6 = pfVar4->feature_name;
      } while (pcVar6 != (char *)0x0);
      feature_count = feature_count + 1;
      ppcVar1 = ppcVar3 + 1;
      ppcVar3 = ppcVar3 + 1;
      pcVar6 = *ppcVar1;
    }
  }
  return CVar5;
}

Assistant:

CURLcode get_libcurl_info(void)
{
  CURLcode result = CURLE_OK;
  const char *const *builtin;

  /* Pointer to libcurl's runtime version information */
  curlinfo = curl_version_info(CURLVERSION_NOW);
  if(!curlinfo)
    return CURLE_FAILED_INIT;

  if(curlinfo->protocols) {
    const struct proto_name_tokenp *p;

    built_in_protos = curlinfo->protocols;

    for(builtin = built_in_protos; !result && *builtin; builtin++) {
      /* Identify protocols we are interested in. */
      for(p = possibly_built_in; p->proto_name; p++)
        if(curl_strequal(p->proto_name, *builtin)) {
          *p->proto_tokenp = *builtin;
          break;
        }
    }
    proto_count = builtin - built_in_protos;
  }

  if(curlinfo->age >= CURLVERSION_ELEVENTH && curlinfo->feature_names)
    feature_names = curlinfo->feature_names;
  else {
    const struct feature_name_presentp *p;
    const char **cpp = fnames;

    for(p = maybe_feature; p->feature_name; p++)
      if(curlinfo->features & p->feature_bitmask)
        *cpp++ = p->feature_name;
    *cpp = NULL;
  }

  /* Identify features we are interested in. */
  for(builtin = feature_names; *builtin; builtin++) {
    const struct feature_name_presentp *p;

    for(p = maybe_feature; p->feature_name; p++)
      if(curl_strequal(p->feature_name, *builtin)) {
        if(p->feature_presentp)
          *p->feature_presentp = TRUE;
        break;
      }
    ++feature_count;
  }

  return CURLE_OK;
}